

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::init_allowed__markup(t_html_generator *this)

{
  mapped_type *pmVar1;
  allocator local_861;
  key_type local_860;
  allocator local_839;
  key_type local_838;
  allocator local_811;
  key_type local_810;
  allocator local_7e9;
  key_type local_7e8;
  allocator local_7c1;
  key_type local_7c0;
  allocator local_799;
  key_type local_798;
  allocator local_771;
  key_type local_770;
  allocator local_749;
  key_type local_748;
  allocator local_721;
  key_type local_720;
  allocator local_6f9;
  key_type local_6f8;
  allocator local_6d1;
  key_type local_6d0;
  allocator local_6a9;
  key_type local_6a8;
  allocator local_681;
  key_type local_680;
  allocator local_659;
  key_type local_658;
  allocator local_631;
  key_type local_630;
  allocator local_609;
  key_type local_608;
  allocator local_5e1;
  key_type local_5e0;
  allocator local_5b9;
  key_type local_5b8;
  allocator local_591;
  key_type local_590;
  allocator local_569;
  key_type local_568;
  allocator local_541;
  key_type local_540;
  allocator local_519;
  key_type local_518;
  allocator local_4f1;
  key_type local_4f0;
  allocator local_4c9;
  key_type local_4c8;
  allocator local_4a1;
  key_type local_4a0;
  allocator local_479;
  key_type local_478;
  allocator local_451;
  key_type local_450;
  allocator local_429;
  key_type local_428;
  allocator local_401;
  key_type local_400;
  allocator local_3d9;
  key_type local_3d8;
  allocator local_3b1;
  key_type local_3b0;
  allocator local_389;
  key_type local_388;
  allocator local_361;
  key_type local_360;
  allocator local_339;
  key_type local_338;
  allocator local_311;
  key_type local_310;
  allocator local_2e9;
  key_type local_2e8;
  allocator local_2c1;
  key_type local_2c0;
  allocator local_299;
  key_type local_298;
  allocator local_271;
  key_type local_270;
  allocator local_249;
  key_type local_248;
  allocator local_221;
  key_type local_220;
  allocator local_1f9;
  key_type local_1f8;
  allocator local_1d1;
  key_type local_1d0;
  allocator local_1a9;
  key_type local_1a8;
  allocator local_181;
  key_type local_180;
  allocator local_159;
  key_type local_158;
  allocator local_131;
  key_type local_130;
  allocator local_109;
  key_type local_108;
  allocator local_e1;
  key_type local_e0;
  allocator local_b9;
  key_type local_b8;
  allocator local_91;
  key_type local_90;
  allocator local_69;
  key_type local_68;
  allocator local_31;
  key_type local_30;
  t_html_generator *local_10;
  t_html_generator *this_local;
  
  local_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&this->allowed_markup);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"br",&local_31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_30);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"br/",&local_69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_68);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"img",&local_91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_90);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"b",&local_b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_b8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"/b",&local_e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_e0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"u",&local_109);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_108);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"/u",&local_131);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_130);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"i",&local_159);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_158);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"/i",&local_181);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_180);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"s",&local_1a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_1a8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"/s",&local_1d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_1d0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"big",&local_1f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_1f8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"/big",&local_221);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_220);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"small",&local_249);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_248);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"/small",&local_271);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_270);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"sup",&local_299);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_298);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"/sup",&local_2c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_2c0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"sub",&local_2e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_2e8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"/sub",&local_311);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_310);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"pre",&local_339);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_338);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"/pre",&local_361);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_360);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"tt",&local_389);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_388);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,"/tt",&local_3b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_3b0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"ul",&local_3d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_3d8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"/ul",&local_401);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_400);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"ol",&local_429);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_428);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"/ol",&local_451);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_450);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"li",&local_479);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_478);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"/li",&local_4a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_4a0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"a",&local_4c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_4c8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,"/a",&local_4f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_4f0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"p",&local_519);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_518);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"/p",&local_541);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_540);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"code",&local_569);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_568);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"/code",&local_591);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_590);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"dl",&local_5b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_5b8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"/dl",&local_5e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_5e0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_608,"dt",&local_609);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_608);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,"/dt",&local_631);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_630);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"dd",&local_659);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_658);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"/dd",&local_681);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_680);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"h1",&local_6a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_6a8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6d0,"/h1",&local_6d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_6d0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f8,"h2",&local_6f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_6f8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_720,"/h2",&local_721);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_720);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_748,"h3",&local_749);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_748);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,"/h3",&local_771);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_770);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"h4",&local_799);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_798);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,"/h4",&local_7c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_7c0);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"h5",&local_7e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_7e8);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_810,"/h5",&local_811);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_810);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_838,"h6",&local_839);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_838);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_860,"/h6",&local_861);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->allowed_markup,&local_860);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  return;
}

Assistant:

void t_html_generator::init_allowed__markup() {
  allowed_markup.clear();
  // standalone tags
  allowed_markup["br"] = 1;
  allowed_markup["br/"] = 1;
  allowed_markup["img"] = 1;
  // paired tags
  allowed_markup["b"] = 1;
  allowed_markup["/b"] = 1;
  allowed_markup["u"] = 1;
  allowed_markup["/u"] = 1;
  allowed_markup["i"] = 1;
  allowed_markup["/i"] = 1;
  allowed_markup["s"] = 1;
  allowed_markup["/s"] = 1;
  allowed_markup["big"] = 1;
  allowed_markup["/big"] = 1;
  allowed_markup["small"] = 1;
  allowed_markup["/small"] = 1;
  allowed_markup["sup"] = 1;
  allowed_markup["/sup"] = 1;
  allowed_markup["sub"] = 1;
  allowed_markup["/sub"] = 1;
  allowed_markup["pre"] = 1;
  allowed_markup["/pre"] = 1;
  allowed_markup["tt"] = 1;
  allowed_markup["/tt"] = 1;
  allowed_markup["ul"] = 1;
  allowed_markup["/ul"] = 1;
  allowed_markup["ol"] = 1;
  allowed_markup["/ol"] = 1;
  allowed_markup["li"] = 1;
  allowed_markup["/li"] = 1;
  allowed_markup["a"] = 1;
  allowed_markup["/a"] = 1;
  allowed_markup["p"] = 1;
  allowed_markup["/p"] = 1;
  allowed_markup["code"] = 1;
  allowed_markup["/code"] = 1;
  allowed_markup["dl"] = 1;
  allowed_markup["/dl"] = 1;
  allowed_markup["dt"] = 1;
  allowed_markup["/dt"] = 1;
  allowed_markup["dd"] = 1;
  allowed_markup["/dd"] = 1;
  allowed_markup["h1"] = 1;
  allowed_markup["/h1"] = 1;
  allowed_markup["h2"] = 1;
  allowed_markup["/h2"] = 1;
  allowed_markup["h3"] = 1;
  allowed_markup["/h3"] = 1;
  allowed_markup["h4"] = 1;
  allowed_markup["/h4"] = 1;
  allowed_markup["h5"] = 1;
  allowed_markup["/h5"] = 1;
  allowed_markup["h6"] = 1;
  allowed_markup["/h6"] = 1;
}